

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

KeyValue * __thiscall
google::protobuf::Arena::CreateInternalRawArray<google::protobuf::internal::ExtensionSet::KeyValue>
          (Arena *this,size_t num_elements)

{
  LogMessage *pLVar1;
  KeyValue *pKVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (num_elements >> 0x3b != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
               ,0x26b);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"Requested size is too large to fit into size_t.");
    internal::LogFinisher::operator=(&local_59,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  pKVar2 = (KeyValue *)
           AllocateAlignedWithHook
                     (this,num_elements << 5,
                      (type_info *)&internal::ExtensionSet::KeyValue::typeinfo);
  return pKVar2;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* CreateInternalRawArray(size_t num_elements) {
    GOOGLE_CHECK_LE(num_elements, std::numeric_limits<size_t>::max() / sizeof(T))
        << "Requested size is too large to fit into size_t.";
    // We count on compiler to realize that if sizeof(T) is a multiple of
    // 8 AlignUpTo can be elided.
    const size_t n = sizeof(T) * num_elements;
    return static_cast<T*>(
        AllocateAlignedWithHook(n, alignof(T), RTTI_TYPE_ID(T)));
  }